

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::shear<float>(Matrix44<float> *this,Vec3<float> *h)

{
  int i;
  Vec3<float> *h_local;
  Matrix44<float> *this_local;
  
  for (i = 0; i < 4; i = i + 1) {
    this->x[2][i] = h->y * this->x[0][i] + h->z * this->x[1][i] + this->x[2][i];
    this->x[1][i] = h->x * this->x[0][i] + this->x[1][i];
  }
  return this;
}

Assistant:

const Matrix44<T>&
                 Matrix44<T>::shear (const Vec3<S>& h) IMATH_NOEXCEPT
{
    //
    // In this case, we don't need a temp. copy of the matrix
    // because we never use a value on the RHS after we've
    // changed it on the LHS.
    //

    for (int i = 0; i < 4; i++)
    {
        x[2][i] += h.y * x[0][i] + h.z * x[1][i];
        x[1][i] += h.x * x[0][i];
    }

    return *this;
}